

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool BaseFile_Replace(TFileStream *pStream,TFileStream *pNewStream)

{
  int iVar1;
  DWORD *pDVar2;
  TFileStream *pNewStream_local;
  TFileStream *pStream_local;
  
  iVar1 = rename(pNewStream->szFileName,pStream->szFileName);
  if (iVar1 == -1) {
    pDVar2 = (DWORD *)__errno_location();
    SetLastError(*pDVar2);
  }
  return iVar1 != -1;
}

Assistant:

static bool BaseFile_Replace(TFileStream * pStream, TFileStream * pNewStream)
{
#ifdef PLATFORM_WINDOWS
    // Delete the original stream file. Don't check the result value,
    // because if the file doesn't exist, it would fail
    DeleteFile(pStream->szFileName);

    // Rename the new file to the old stream's file
    return (bool)MoveFile(pNewStream->szFileName, pStream->szFileName);
#endif

#if defined(PLATFORM_MAC) || defined(PLATFORM_LINUX)
    // "rename" on Linux also works if the target file exists
    if(rename(pNewStream->szFileName, pStream->szFileName) == -1)
    {
        SetLastError(errno);
        return false;
    }

    return true;
#endif
}